

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O1

string * __thiscall
google::protobuf::MethodDescriptorProto::mutable_output_type_abi_cxx11_(MethodDescriptorProto *this)

{
  string *psVar1;
  
  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
  if (this->output_type_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar1 = (string *)operator_new(0x20);
    (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
    psVar1->_M_string_length = 0;
    (psVar1->field_2)._M_local_buf[0] = '\0';
    this->output_type_ = psVar1;
  }
  return this->output_type_;
}

Assistant:

inline ::std::string* MethodDescriptorProto::mutable_output_type() {
  set_has_output_type();
  if (output_type_ == &::google::protobuf::internal::kEmptyString) {
    output_type_ = new ::std::string;
  }
  return output_type_;
}